

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O1

int unquantize_i4r4(long row,int *input,long ntodo,double scale,double zero,int dither_method,
                   int nullcheck,int tnull,float nullval,char *nullarray,int *anynull,float *output,
                   int *status)

{
  int iVar1;
  float *pfVar2;
  float *pfVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  float fVar8;
  
  if (fits_rand_value == (float *)0x0) {
    uVar6 = fits_init_randoms();
    pfVar3 = (float *)(ulong)uVar6;
    if (uVar6 != 0) goto LAB_001d2511;
  }
  pfVar2 = fits_rand_value;
  uVar7 = (row + -1) % 10000;
  iVar4 = (int)(fits_rand_value[uVar7] * 500.0);
  pfVar3 = output;
  if (nullcheck == 0) {
    if (0 < ntodo) {
      lVar5 = 0;
      do {
        if ((dither_method != 2) || (fVar8 = 0.0, input[lVar5] != -0x7ffffffe)) {
          fVar8 = (float)((((double)input[lVar5] - (double)pfVar2[iVar4]) + 0.5) * scale + zero);
        }
        output[lVar5] = fVar8;
        iVar4 = iVar4 + 1;
        if (iVar4 == 10000) {
          uVar6 = (int)uVar7 + 1;
          uVar7 = (ulong)uVar6;
          if (uVar6 == 10000) {
            uVar7 = 0;
          }
          iVar4 = (int)(pfVar2[(int)uVar7] * 500.0);
        }
        lVar5 = lVar5 + 1;
      } while (ntodo != lVar5);
    }
  }
  else if (0 < ntodo) {
    lVar5 = 0;
    do {
      iVar1 = input[lVar5];
      if (iVar1 == tnull) {
        *anynull = 1;
        if (nullcheck == 1) {
          output[lVar5] = nullval;
        }
        else {
          nullarray[lVar5] = '\x01';
        }
      }
      else if ((dither_method == 2) && (iVar1 == -0x7ffffffe)) {
        output[lVar5] = 0.0;
      }
      else {
        output[lVar5] =
             (float)((((double)iVar1 - (double)fits_rand_value[iVar4]) + 0.5) * scale + zero);
      }
      iVar4 = iVar4 + 1;
      if (iVar4 == 10000) {
        uVar6 = (int)uVar7 + 1;
        uVar7 = (ulong)uVar6;
        if (uVar6 == 10000) {
          uVar7 = 0;
        }
        iVar4 = (int)(fits_rand_value[(int)uVar7] * 500.0);
      }
      lVar5 = lVar5 + 1;
    } while (ntodo != lVar5);
  }
LAB_001d2511:
  return (int)pfVar3;
}

Assistant:

static int unquantize_i4r4(long row, /* tile number = row number in table    */
            INT32BIT *input,      /* I - array of values to be converted     */
            long ntodo,           /* I - number of elements in the array     */
            double scale,         /* I - FITS TSCALn or BSCALE value         */
            double zero,          /* I - FITS TZEROn or BZERO  value         */
            int dither_method,    /* I - dithering method to use             */
            int nullcheck,        /* I - null checking code; 0 = don't check */
                                  /*     1:set null pixels = nullval         */
                                  /*     2: if null pixel, set nullarray = 1 */
            INT32BIT tnull,       /* I - value of FITS TNULLn keyword if any */
            float nullval,        /* I - set null pixels, if nullcheck = 1   */
            char *nullarray,      /* I - bad pixel array, if nullcheck = 2   */
            int  *anynull,        /* O - set to 1 if any pixels are null     */
            float *output,        /* O - array of converted pixels           */
            int *status)          /* IO - error status                       */
/*
    Unquantize int integer values into the scaled floating point values
*/
{
    long ii;
    int nextrand, iseed;

    if (fits_rand_value == 0) 
       if (fits_init_randoms()) return(MEMORY_ALLOCATION);

    /* initialize the index to the next random number in the list */
    iseed = (int) ((row - 1) % N_RANDOM);
    nextrand = (int) (fits_rand_value[iseed] * 500);

    if (nullcheck == 0)     /* no null checking required */
    {
            for (ii = 0; ii < ntodo; ii++)
            {
                if (dither_method == SUBTRACTIVE_DITHER_2 && input[ii] == ZERO_VALUE)
		    output[ii] = 0.0;
		else
                    output[ii] = (float) (((double) input[ii] - fits_rand_value[nextrand] + 0.5) * scale + zero);

	        nextrand++;
	        if (nextrand == N_RANDOM) {
	            iseed++;
		    if (iseed == N_RANDOM) iseed = 0;
		    nextrand = (int) (fits_rand_value[iseed] * 500);
	        }
            }
    }
    else        /* must check for null values */
    {
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] == tnull)
                {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                }
                else
                {
                    if (dither_method == SUBTRACTIVE_DITHER_2 && input[ii] == ZERO_VALUE)
		        output[ii] = 0.0;
		    else
                        output[ii] = (float) (((double) input[ii] - fits_rand_value[nextrand] + 0.5) * scale + zero);
                }

	        nextrand++;
	        if (nextrand == N_RANDOM) {
	            iseed++;
		    if (iseed == N_RANDOM) iseed = 0;
		    nextrand = (int) (fits_rand_value[iseed] * 500);
	        }
            }
    }

    return(*status);
}